

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::EndDataSegmentInitExpr
          (BinaryReaderInterp *this,Index index)

{
  InitExprKind IVar1;
  Index index_00;
  undefined4 uVar2;
  bool bVar3;
  Result result;
  reference pvVar4;
  DataDesc *data;
  Location local_90;
  Var local_70;
  Enum local_28;
  Type local_24;
  Enum local_20;
  Index local_1c;
  BinaryReaderInterp *pBStack_18;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  IVar1 = (this->init_expr_).kind;
  local_1c = index;
  pBStack_18 = this;
  if (IVar1 == I32) {
    Type::Type(&local_24,I32);
    local_20 = (Enum)SharedValidator::OnDataSegmentInitExpr_Const
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,local_24)
    ;
    bVar3 = Failed((Result)local_20);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  else if (IVar1 == GlobalGet) {
    index_00 = (this->init_expr_).field_1.i32_;
    Location::Location(&local_90);
    Var::Var(&local_70,index_00,&local_90);
    local_28 = (Enum)SharedValidator::OnDataSegmentInitExpr_GlobalGet
                               (&this->validator_,
                                (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_70
                               );
    bVar3 = Failed((Result)local_28);
    Var::~Var(&local_70);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  else {
    result = SharedValidator::OnDataSegmentInitExpr_Other
                       (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc
                       );
    bVar3 = Failed(result);
    if (bVar3) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  }
  pvVar4 = std::vector<wabt::interp::DataDesc,_std::allocator<wabt::interp::DataDesc>_>::back
                     (&this->module_->datas);
  uVar2 = *(undefined4 *)&(this->init_expr_).field_0x4;
  (pvVar4->offset).kind = (this->init_expr_).kind;
  *(undefined4 *)&(pvVar4->offset).field_0x4 = uVar2;
  (pvVar4->offset).field_1.i64_ = (this->init_expr_).field_1.i64_;
  *(undefined8 *)((long)&(pvVar4->offset).field_1 + 8) =
       *(undefined8 *)((long)&(this->init_expr_).field_1 + 8);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::EndDataSegmentInitExpr(Index index) {
  switch (init_expr_.kind) {
    case InitExprKind::I32:
      CHECK_RESULT(validator_.OnDataSegmentInitExpr_Const(loc, ValueType::I32));
      break;

    case InitExprKind::GlobalGet:
      CHECK_RESULT(validator_.OnDataSegmentInitExpr_GlobalGet(
          loc, Var(init_expr_.index_)));
      break;

    default:
      CHECK_RESULT(validator_.OnDataSegmentInitExpr_Other(loc));
      break;
  }

  DataDesc& data = module_.datas.back();
  data.offset = init_expr_;
  return Result::Ok;
}